

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

int64 __thiscall
TTD::EventLog::FindSnapTimeForEventTime(EventLog *this,int64 targetTime,int64 *optEndSnapTime)

{
  BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  EventLogEntry *pEVar2;
  long lVar3;
  SnapshotEventLogEntry *pSVar4;
  undefined1 local_68 [8];
  Iterator iter;
  bool local_33;
  bool local_32;
  bool local_31 [6];
  bool isSnap;
  bool isRoot;
  bool hasRtrSnap;
  
  if (optEndSnapTime != (int64 *)0x0) {
    *optEndSnapTime = -1;
  }
  iter.m_previousEventMap =
       (BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)optEndSnapTime;
  TTEventList::GetIteratorAtLast_ReplayOnly((Iterator *)local_68,&this->m_eventList);
  while (((local_68 != (undefined1  [8])0x0 &&
          (*(TTEventListLink **)((long)local_68 + 8) <= iter.m_currLink)) &&
         (iter.m_currLink < (TTEventListLink *)*(size_t *)local_68))) {
    local_33 = false;
    local_32 = false;
    local_31[0] = false;
    pEVar2 = TTEventList::Iterator::Current((Iterator *)local_68);
    lVar3 = NSLogEvents::AccessTimeInRootCallOrSnapshot(pEVar2,&local_33,&local_32,local_31);
    if ((lVar3 <= targetTime) && ((local_31[0] & local_32) != 0 || local_33 != false))
    goto LAB_00809329;
    TTEventList::Iterator::MovePrevious_ReplayOnly((Iterator *)local_68);
  }
  lVar3 = -1;
LAB_00809329:
  pBVar1 = iter.m_previousEventMap;
  if (iter.m_previousEventMap ==
      (BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    return lVar3;
  }
  TTEventList::GetIteratorAtFirst((Iterator *)local_68,&this->m_eventList);
  while( true ) {
    if (local_68 == (undefined1  [8])0x0) {
      return lVar3;
    }
    if (iter.m_currLink < *(TTEventListLink **)((long)local_68 + 8)) break;
    if ((TTEventListLink *)*(size_t *)local_68 <= iter.m_currLink) {
      return lVar3;
    }
    pEVar2 = TTEventList::Iterator::Current((Iterator *)local_68);
    if (pEVar2->EventKind == SnapshotTag) {
      pEVar2 = TTEventList::Iterator::Current((Iterator *)local_68);
      pSVar4 = NSLogEvents::
               GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                         (pEVar2);
      if (lVar3 < (long)pSVar4->RestoreTimestamp) {
        pBVar1->buckets = (Type)pSVar4->RestoreTimestamp;
        return lVar3;
      }
    }
    TTEventList::Iterator::MoveNext((Iterator *)local_68);
  }
  return lVar3;
}

Assistant:

int64 EventLog::FindSnapTimeForEventTime(int64 targetTime, int64* optEndSnapTime)
    {
        int64 snapTime = -1;
        if(optEndSnapTime != nullptr)
        {
            *optEndSnapTime = -1;
        }

        for(auto iter = this->m_eventList.GetIteratorAtLast_ReplayOnly(); iter.IsValid(); iter.MovePrevious_ReplayOnly())
        {
            bool isSnap = false;
            bool isRoot = false;
            bool hasRtrSnap = false;
            int64 time = NSLogEvents::AccessTimeInRootCallOrSnapshot(iter.Current(), isSnap, isRoot, hasRtrSnap);

            bool validSnap =  isSnap | (isRoot & hasRtrSnap);
            if(validSnap && time <= targetTime)
            {
                snapTime = time;
                break;
            }
        }

        if(optEndSnapTime != nullptr)
        {
            for(auto iter = this->m_eventList.GetIteratorAtFirst(); iter.IsValid(); iter.MoveNext())
            {
                if(iter.Current()->EventKind == NSLogEvents::EventKind::SnapshotTag)
                {
                    NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(iter.Current());
                    if(snapEvent->RestoreTimestamp > snapTime)
                    {
                        *optEndSnapTime = snapEvent->RestoreTimestamp;
                        break;
                    }
                }
            }
        }

        return snapTime;
    }